

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void optimize(Module *module)

{
  size_t sVar1;
  int iVar2;
  Stats stats;
  FuncAttr funcAttr;
  Stats local_d8;
  FuncAttr local_d0;
  
  local_d8.module = module;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Original:\n",10);
  printIRStats(&local_d8);
  local_d0.globalVarUses._M_h._M_buckets = &local_d0.globalVarUses._M_h._M_single_bucket;
  local_d0.globalVarUses._M_h._M_bucket_count = 1;
  local_d0.globalVarUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d0.globalVarUses._M_h._M_element_count = 0;
  local_d0.globalVarUses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d0.globalVarUses._M_h._M_rehash_policy._M_next_resize = 0;
  local_d0.globalVarUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d0.globalVarDefs._M_h._M_buckets = &local_d0.globalVarDefs._M_h._M_single_bucket;
  local_d0.globalVarDefs._M_h._M_bucket_count = 1;
  local_d0.globalVarDefs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d0.globalVarDefs._M_h._M_element_count = 0;
  local_d0.globalVarDefs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d0.globalVarDefs._M_h._M_rehash_policy._M_next_resize = 0;
  local_d0.globalVarDefs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d0.pureFuncs._M_h._M_buckets = &local_d0.pureFuncs._M_h._M_single_bucket;
  local_d0.pureFuncs._M_h._M_bucket_count = 1;
  local_d0.pureFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d0.pureFuncs._M_h._M_element_count = 0;
  local_d0.pureFuncs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d0.pureFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  local_d0.pureFuncs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  mocker::runOptPasses<mocker::SparseSimpleConstantPropagation>(module);
  mocker::runOptPasses<mocker::GlobalConstantInline>(module);
  mocker::FuncAttr::init(&local_d0,(EVP_PKEY_CTX *)module);
  mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
  mocker::runOptPasses<mocker::FunctionInline>(module);
  mocker::runOptPasses<mocker::UnusedFunctionRemoval>(module);
  mocker::runOptPasses<mocker::FunctionInline>(module);
  mocker::runOptPasses<mocker::UnusedFunctionRemoval>(module);
  mocker::runOptPasses<mocker::FunctionInline>(module);
  mocker::runOptPasses<mocker::UnusedFunctionRemoval>(module);
  mocker::runOptPasses<mocker::PromoteGlobalVariables>(module);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nAfter inline and promotion of global variables:\n",0x31);
  printIRStats(&local_d8);
  mocker::runOptPasses<mocker::RewriteBranches>(module);
  mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
  mocker::runOptPasses<mocker::MergeBlocks>(module);
  mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nAfter pre-SSA optimization:\n",0x1d);
  printIRStats(&local_d8);
  mocker::runOptPasses<mocker::SSAConstruction>(module);
  mocker::FuncAttr::init(&local_d0,(EVP_PKEY_CTX *)module);
  mocker::runOptPasses<mocker::DeadCodeElimination,mocker::FuncAttr&>(module,&local_d0);
  mocker::runOptPasses<mocker::RewriteBranches>(module);
  mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
  mocker::runOptPasses<mocker::MergeBlocks>(module);
  mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
  runOptsUntilFixedPoint(module);
  mocker::FuncAttr::init(&local_d0,(EVP_PKEY_CTX *)module);
  mocker::runOptPasses<mocker::LoopInvariantCodeMotion,mocker::FuncAttr&>(module,&local_d0);
  runOptsUntilFixedPoint(module);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nBefore SSA destruction:\n",0x19);
  printIRStats(&local_d8);
  mocker::runOptPasses<mocker::SSADestruction>(module);
  sVar1 = mocker::ir::Stats::countInsts<mocker::ir::Phi>(&local_d8);
  if (sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nAfter SSA destruction:\n",0x18);
    printIRStats(&local_d8);
    runOptsUntilFixedPoint(module);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nAfter optimization:\n",0x15);
    printIRStats(&local_d8);
    mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    mocker::runOptPasses<mocker::SSAConstruction>(module);
    iVar2 = 3;
    do {
      mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
      mocker::runOptPasses<mocker::MergeBlocks>(module);
      mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
      mocker::FuncAttr::init(&local_d0,(EVP_PKEY_CTX *)module);
      mocker::runOptPasses<mocker::DeadCodeElimination,mocker::FuncAttr&>(module,&local_d0);
      mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    mocker::runOptPasses<mocker::CodegenPreparation>(module);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nAfter SSA reconstruction:\n",0x1b);
    printIRStats(&local_d8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_d0.pureFuncs._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d0.globalVarDefs._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_d0);
    return;
  }
  __assert_fail("stats.countInsts<ir::Phi>() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/main.cpp"
                ,0xa7,"void optimize(mocker::ir::Module &)");
}

Assistant:

void optimize(mocker::ir::Module &module) {
  // ATTENTION!
  // * Unreachable blocks should be removed as soon as possible since every
  //   pass that uses the dominator tree requires such blocks having been
  //   removed.

  using namespace mocker;

  mocker::ir::Stats stats(module);
  std::cerr << "Original:\n";
  printIRStats(stats);

  FuncAttr funcAttr;

  runOptPasses<SparseSimpleConstantPropagation>(module);
  runOptPasses<GlobalConstantInline>(module);

  funcAttr.init(module);
  runOptPasses<RemoveUnreachableBlocks>(module);
  runOptPasses<FunctionInline>(module);
  runOptPasses<UnusedFunctionRemoval>(module);
  runOptPasses<FunctionInline>(module);
  runOptPasses<UnusedFunctionRemoval>(module);
  runOptPasses<FunctionInline>(module);
  runOptPasses<UnusedFunctionRemoval>(module);

  runOptPasses<PromoteGlobalVariables>(module);

  std::cerr << "\nAfter inline and promotion of global variables:\n";
  printIRStats(stats);

  runOptPasses<RewriteBranches>(module);
  runOptPasses<SimplifyPhiFunctions>(module);
  runOptPasses<MergeBlocks>(module);
  runOptPasses<RemoveUnreachableBlocks>(module);

  std::cerr << "\nAfter pre-SSA optimization:\n";
  printIRStats(stats);

  runOptPasses<SSAConstruction>(module);
  funcAttr.init(module);
  runOptPasses<DeadCodeElimination>(module, funcAttr);

  runOptPasses<RewriteBranches>(module);
  runOptPasses<SimplifyPhiFunctions>(module);
  runOptPasses<MergeBlocks>(module);
  runOptPasses<RemoveUnreachableBlocks>(module);
  runOptsUntilFixedPoint(module);
  funcAttr.init(module);
  runOptPasses<LoopInvariantCodeMotion>(module, funcAttr);
  runOptsUntilFixedPoint(module);

  std::cerr << "\nBefore SSA destruction:\n";
  printIRStats(stats);
  runOptPasses<SSADestruction>(module);
  assert(stats.countInsts<ir::Phi>() == 0);

  std::cerr << "\nAfter SSA destruction:\n";
  printIRStats(stats);

  runOptsUntilFixedPoint(module);

  std::cerr << "\nAfter optimization:\n";
  printIRStats(stats);

  runOptPasses<RemoveUnreachableBlocks>(module);
  runOptPasses<SSAConstruction>(module);
  for (int i = 0; i < 3; ++i) {
    runOptPasses<SimplifyPhiFunctions>(module);
    runOptPasses<MergeBlocks>(module);
    runOptPasses<RemoveUnreachableBlocks>(module);
    funcAttr.init(module);
    runOptPasses<DeadCodeElimination>(module, funcAttr);
    runOptPasses<RemoveUnreachableBlocks>(module);
  }

  runOptPasses<CodegenPreparation>(module);

  std::cerr << "\nAfter SSA reconstruction:\n";
  printIRStats(stats);
}